

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

array_range_type __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  array_storage *paVar2;
  string *s;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_ffffffffffffff88;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  json_runtime_error<std::domain_error,_void> *this_00;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_28;
  __normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffffe0;
  array_range_type local_10;
  
  jVar1 = storage_kind(in_RDI);
  if (jVar1 == json_reference) {
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffff90);
    json_reference_storage::value((json_reference_storage *)0x36dbab);
    local_10 = array_range(in_stack_ffffffffffffffe0._M_current);
  }
  else {
    if (jVar1 != array) {
      s = (string *)__cxa_allocate_exception(0x18);
      this_00 = (json_runtime_error<std::domain_error,_void> *)&stack0xffffffffffffffb7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,s);
      __cxa_throw(s,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    paVar2 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                       (in_stack_ffffffffffffff90);
    array_storage::value(paVar2);
    json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
    ::begin(in_stack_ffffffffffffff88);
    paVar2 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                       (in_stack_ffffffffffffff90);
    array_storage::value(paVar2);
    local_28._M_current =
         (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
         json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
         ::end(in_stack_ffffffffffffff88);
    range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
    ::range(&local_10,
            (__normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             *)&stack0xffffffffffffffe0,&local_28);
  }
  return local_10;
}

Assistant:

array_range_type array_range()
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    return array_range_type(cast<array_storage>().value().begin(),
                        cast<array_storage>().value().end());
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().array_range();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not an array"));
            }
        }